

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_connectionErrorNoMapVariablesType_Test::TestBody
          (Parser_connectionErrorNoMapVariablesType_Test *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  shared_ptr<libcellml::Logger> local_138;
  ScopedTrace local_121;
  undefined1 local_120 [7];
  ScopedTrace gtest_trace_1404;
  undefined1 local_110 [8];
  ParserPtr p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  allocator<char> local_31;
  string local_30 [8];
  string in;
  Parser_connectionErrorNoMapVariablesType_Test *this_local;
  
  in.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component1\">\n    <variable name=\"variable1\" units=\"scrat\"/>\n  </component>\n  <component name=\"component2\">\n    <variable name=\"variable2\" units=\"phils\"/>\n  </component>\n  <connection component_1=\"component1\"  component_2=\"component2\">\n    <map_variabels variable_1=\"variable1\" variable_2=\"variable2\"/>\n  </connection>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "Connection in model \'\' has an invalid child element \'map_variabels\'.",
             (allocator<char> *)
             ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"Connection in model \'\' does not have a map_variables element.",
             (allocator<char> *)
             ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,
             "Model does not contain the units \'scrat\' required by variable \'variable1\' in component \'component1\'."
             ,(allocator<char> *)
              ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,
             "Model does not contain the units \'phils\' required by variable \'variable2\' in component \'component2\'."
             ,(allocator<char> *)
              ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4));
  p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 0;
  local_70 = &local_f0;
  local_68 = 4;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 2);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 2));
  local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70;
  do {
    local_190 = local_190 + -1;
    std::__cxx11::string::~string((string *)local_190);
  } while (local_190 != &local_f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 4));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Parser::create
            (SUB81((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_110,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_110);
  libcellml::Parser::parseModel((string *)local_120);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_120);
  testing::ScopedTrace::ScopedTrace
            (&local_121,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
             ,0x57c,"Issue occurred here.");
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Parser,void>
            (&local_138,(shared_ptr<libcellml::Parser> *)local_110);
  expectEqualIssues((vector *)local_60,(shared_ptr *)&local_138);
  std::shared_ptr<libcellml::Logger>::~shared_ptr(&local_138);
  testing::ScopedTrace::~ScopedTrace(&local_121);
  std::shared_ptr<libcellml::Parser>::~shared_ptr((shared_ptr<libcellml::Parser> *)local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Parser, connectionErrorNoMapVariablesType)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1\" units=\"scrat\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\" units=\"phils\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\"  component_2=\"component2\">\n"
        "    <map_variabels variable_1=\"variable1\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Connection in model '' has an invalid child element 'map_variabels'.",
        "Connection in model '' does not have a map_variables element.",
        "Model does not contain the units 'scrat' required by variable 'variable1' in component 'component1'.",
        "Model does not contain the units 'phils' required by variable 'variable2' in component 'component2'.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}